

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stresstest.c
# Opt level: O3

int verify(EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  uchar *puVar4;
  
  uVar3 = 1;
  if (1 < (uint)sig) {
    if ((long)*(size_t *)(ctx + 8) < *(long *)ctx) {
      uVar3 = 0;
      puVar4 = (uchar *)0x1;
    }
    else {
      tbs = (uchar *)((ulong)sig & 0xffffffff);
      siglen = 2 - (long)tbs;
      puVar4 = (uchar *)0x1;
      sVar2 = *(size_t *)(ctx + 8);
      do {
        if (puVar4 + siglen == (uchar *)0x1) {
          return 1;
        }
        tbslen = *(size_t *)(ctx + (long)puVar4 * 8 + 8);
        puVar4 = puVar4 + 1;
        bVar1 = (long)sVar2 <= (long)tbslen;
        sVar2 = tbslen;
      } while (bVar1);
      uVar3 = (uint)(tbs <= puVar4);
    }
    printf("Verify failed! at %d",puVar4,siglen,tbs,tbslen);
  }
  return uVar3;
}

Assistant:

int verify(int64_t *dst, const unsigned size) {
  for (unsigned i = 1; i < size; i++) {
    if (dst[i - 1] > dst[i]) {
      printf("Verify failed! at %d", i);
      return 0;
    }
  }
  return 1;
}